

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

size_t __thiscall
anon_unknown.dwarf_d5a34::filename_pos(anon_unknown_dwarf_d5a34 *this,StringRef str,Style style)

{
  char cVar1;
  bool bVar2;
  Style SVar3;
  char *__s;
  Style style_00;
  StringRef local_78;
  size_type local_68;
  size_t pos;
  undefined1 auStack_58 [4];
  Style style_local;
  StringRef str_local;
  
  str_local.Data = str.Data;
  style_00 = (Style)str.Length;
  _auStack_58 = this;
  if (str_local.Data != (char *)0x0) {
    cVar1 = llvm::StringRef::operator[]((StringRef *)auStack_58,(size_t)(str_local.Data + -1));
    bVar2 = llvm::sys::path::is_separator(cVar1,style_00);
    if (bVar2) {
      return (size_t)(str_local.Data + -1);
    }
  }
  __s = separators(style_00);
  local_78.Data = __s;
  if (__s != (char *)0x0) {
    strlen(__s);
  }
  local_68 = llvm::StringRef::find_last_of
                       ((StringRef *)auStack_58,local_78,(size_t)(str_local.Data + -1));
  SVar3 = real_style(style_00);
  if ((SVar3 == windows) && (local_68 == 0xffffffffffffffff)) {
    local_68 = llvm::StringRef::find_last_of
                         ((StringRef *)auStack_58,':',(size_t)(str_local.Data + -2));
  }
  if (local_68 == 0xffffffffffffffff) {
LAB_00199995:
    str_local.Length = 0;
  }
  else {
    if (local_68 == 1) {
      cVar1 = llvm::StringRef::operator[]((StringRef *)auStack_58,0);
      bVar2 = llvm::sys::path::is_separator(cVar1,style_00);
      if (bVar2) goto LAB_00199995;
    }
    str_local.Length = local_68 + 1;
  }
  return str_local.Length;
}

Assistant:

size_t filename_pos(StringRef str, Style style) {
    if (str.size() > 0 && is_separator(str[str.size() - 1], style))
      return str.size() - 1;

    size_t pos = str.find_last_of(separators(style), str.size() - 1);

    if (real_style(style) == Style::windows) {
      if (pos == StringRef::npos)
        pos = str.find_last_of(':', str.size() - 2);
    }

    if (pos == StringRef::npos || (pos == 1 && is_separator(str[0], style)))
      return 0;

    return pos + 1;
  }